

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K_Sequence_Parser.cpp
# Opt level: O3

h__SequenceParser * __thiscall
ASDCP::JP2K::SequenceParser::h__SequenceParser::ReadFrame(h__SequenceParser *this,FrameBuffer *FB)

{
  int iVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  ILogSink *this_00;
  long in_RDX;
  PictureDescriptor PDesc;
  CodestreamParser local_260 [6];
  PictureDescriptor local_1f8;
  
  puVar2 = *(undefined1 **)&FB[1].super_FrameBuffer.m_SourceLength;
  if ((ui32_t *)puVar2 == &(FB->super_FrameBuffer).m_Capacity) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_ENDOFFILE);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,*(char **)(puVar2 + 0x10),(allocator<char> *)local_260);
    CodestreamParser::OpenReadFrame
              ((CodestreamParser *)this,(string *)(FB + 2),(FrameBuffer *)&local_1f8);
    if (local_1f8.EditRate != (Rational)&local_1f8.SampleRate.Denominator) {
      operator_delete((void *)local_1f8.EditRate,
                      CONCAT44(local_1f8.StoredWidth,local_1f8.SampleRate.Denominator) + 1);
    }
    if (-1 < (int)this->m_FramesRead) {
      if ((char)FB[2].super_FrameBuffer.m_Capacity == '\x01') {
        local_1f8.EditRate.Numerator = 0;
        local_1f8.EditRate.Denominator = 0;
        local_1f8.SampleRate.Numerator = 0;
        local_1f8.SampleRate.Denominator = 0;
        local_1f8.AspectRatio.Numerator = 0;
        local_1f8.AspectRatio.Denominator = 0;
        CodestreamParser::FillPictureDescriptor(local_260,(PictureDescriptor *)(FB + 2));
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_260);
        Kumu::Result_t::~Result_t((Result_t *)local_260);
        if ((int)this->m_FramesRead < 0) {
          return this;
        }
        bVar4 = operator==((PictureDescriptor *)&FB[2].super_FrameBuffer.m_OwnMem,&local_1f8);
        if (!bVar4) {
          this_00 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (this_00,"JPEG-2000 codestream parameters do not match at frame %d\n",
                     (ulong)(*(int *)&(FB->super_FrameBuffer)._vptr_FrameBuffer + 1));
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)ASDCP::RESULT_RAW_FORMAT);
          if ((int)this->m_FramesRead < 0) {
            return this;
          }
        }
      }
      iVar1 = *(int *)&(FB->super_FrameBuffer)._vptr_FrameBuffer;
      *(int *)&(FB->super_FrameBuffer)._vptr_FrameBuffer = iVar1 + 1;
      *(int *)(in_RDX + 0x1c) = iVar1;
      uVar3 = **(undefined8 **)&FB[1].super_FrameBuffer.m_SourceLength;
      FB[1].super_FrameBuffer.m_SourceLength = (int)uVar3;
      FB[1].super_FrameBuffer.m_PlaintextOffset = (int)((ulong)uVar3 >> 0x20);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::JP2K::SequenceParser::h__SequenceParser::ReadFrame(FrameBuffer& FB)
{
  if ( m_CurrentFile == m_FileList.end() )
    return RESULT_ENDOFFILE;

  // open the file
  Result_t result = m_Parser.OpenReadFrame((*m_CurrentFile).c_str(), FB);

  if ( ASDCP_SUCCESS(result) && m_Pedantic )
    {
      PictureDescriptor PDesc;
      result = m_Parser.FillPictureDescriptor(PDesc);

      if ( ASDCP_SUCCESS(result) && ! ( m_PDesc == PDesc ) )
	{
	  Kumu::DefaultLogSink().Error("JPEG-2000 codestream parameters do not match at frame %d\n", m_FramesRead + 1);
	  result = RESULT_RAW_FORMAT;
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      FB.FrameNumber(m_FramesRead++);
      m_CurrentFile++;
    }

  return result;
}